

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void __thiscall
ImageTypeManager::setFunctionTable
          (ImageTypeManager *this,uint8_t type,FunctionTableHolder *table,bool forceSetup)

{
  bool bVar1;
  mapped_type *__dest;
  byte in_CL;
  void *in_RDX;
  key_type *in_RDI;
  map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
  *unaff_retaddr;
  iterator oldTable;
  FunctionTableHolder *in_stack_ffffffffffffffb8;
  FunctionTableHolder *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  byte local_19;
  void *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
       ::find((map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x10ffc1);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
       ::end((map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>::
    operator->((_Rb_tree_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
                *)0x10fff4);
    anon_unknown.dwarf_1e00d::setupTable(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false);
  }
  else {
    __dest = std::
             map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
             ::operator[](unaff_retaddr,in_RDI);
    memcpy(__dest,local_18,0x108);
  }
  return;
}

Assistant:

void ImageTypeManager::setFunctionTable( uint8_t type, const Image_Function_Helper::FunctionTableHolder & table, bool forceSetup )
{
    std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::iterator oldTable = _functionTableMap.find( type );
    if ( oldTable != _functionTableMap.end() )
        setupTable( oldTable->second, table, forceSetup );
    else
        _functionTableMap[type] = table;
}